

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

string * __thiscall
google::protobuf::UnknownFieldSet::AddLengthDelimited_abi_cxx11_(UnknownFieldSet *this,int number)

{
  string *this_00;
  uint32 in_ESI;
  value_type *in_RDI;
  UnknownField field;
  uint32 in_stack_ffffffffffffffe4;
  
  UnknownField::SetType((UnknownField *)&stack0xffffffffffffffe0,TYPE_LENGTH_DELIMITED);
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00);
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  push_back((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             *)CONCAT44(in_stack_ffffffffffffffe4,in_ESI),in_RDI);
  return this_00;
}

Assistant:

std::string* UnknownFieldSet::AddLengthDelimited(int number) {
  UnknownField field;
  field.number_ = number;
  field.SetType(UnknownField::TYPE_LENGTH_DELIMITED);
  field.data_.length_delimited_.string_value = new std::string;
  fields_.push_back(field);
  return field.data_.length_delimited_.string_value;
}